

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O2

void __thiscall
TPZBlockDiagonal<float>::Print
          (TPZBlockDiagonal<float> *this,char *msg,ostream *out,MatrixOutputFormat format)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  if (format == EFormatted) {
    std::operator<<(out,"TPZBlockDiagonal matrix ");
    if (msg != (char *)0x0) {
      std::operator<<(out,msg);
    }
    std::endl<char,std::char_traits<char>>(out);
    lVar7 = (this->fBlockSize).fNElements;
    poVar1 = std::operator<<(out,"Number of blocks ");
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    lVar6 = 0;
    if (lVar7 < 1) {
      lVar7 = lVar6;
    }
    for (; lVar6 != lVar7; lVar6 = lVar6 + 1) {
      lVar3 = (long)(this->fBlockSize).fStore[lVar6];
      poVar1 = std::operator<<(out,"block number ");
      poVar1 = std::ostream::_M_insert<long>((long)poVar1);
      poVar1 = std::operator<<(poVar1," size : ");
      poVar1 = std::ostream::_M_insert<long>((long)poVar1);
      std::endl<char,std::char_traits<char>>(poVar1);
      lVar9 = (this->fBlockPos).fStore[lVar6];
      lVar2 = 0;
      if (0 < lVar3) {
        lVar2 = lVar3;
      }
      for (lVar5 = 0; lVar4 = lVar3, lVar8 = lVar9, lVar5 != lVar2; lVar5 = lVar5 + 1) {
        while (lVar4 != 0) {
          poVar1 = (ostream *)std::ostream::operator<<(out,(this->fStorage).fStore[lVar8]);
          std::operator<<(poVar1,' ');
          lVar4 = lVar4 + -1;
          lVar8 = lVar8 + 1;
        }
        std::endl<char,std::char_traits<char>>(out);
        lVar9 = lVar9 + lVar3;
      }
    }
    return;
  }
  TPZMatrix<float>::Print(&this->super_TPZMatrix<float>,msg,out,format);
  return;
}

Assistant:

void TPZBlockDiagonal<TVar>::Print(const char *msg, std::ostream &out, const MatrixOutputFormat format) const {
	
	if(format != EFormatted)
	{
		TPZMatrix<TVar>::Print(msg,out,format);
		return;
	}
	out << "TPZBlockDiagonal matrix ";
	if(msg) out << msg;
	out  << std::endl;
	
	int64_t nblock = fBlockSize.NElements();
	out << "Number of blocks " << nblock << std::endl; 
	int64_t b,bsize,pos;
	for(b=0; b<nblock; b++) {
		bsize = fBlockSize[b];
		out << "block number " << b << " size : " << bsize << std::endl;
		int64_t r,c;
		pos = fBlockPos[b];
		for(c=0; c<bsize; c++) {
			for(r=0; r<bsize ; r++) {
				out << fStorage[pos+r+bsize*c] << ' ';
			}
			out << std::endl;
		}
	}
}